

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool __thiscall cmStringSorter::operator()(cmStringSorter *this,string *a,string *b)

{
  size_t __n;
  _Alloc_hider __s1;
  ulong uVar1;
  _Alloc_hider __s2;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  string af;
  string bf;
  string local_58;
  string local_38;
  
  ApplyFilter(&local_58,this,a);
  ApplyFilter(&local_38,this,b);
  if (this->descending == true) {
    __n = local_38._M_string_length;
    __s1._M_p = local_38._M_dataplus._M_p;
    uVar1 = local_38._M_string_length;
    __s2._M_p = local_58._M_dataplus._M_p;
    uVar2 = local_58._M_string_length;
    if (local_58._M_string_length < local_38._M_string_length) {
      __n = local_58._M_string_length;
    }
  }
  else {
    __n = local_58._M_string_length;
    __s1._M_p = local_58._M_dataplus._M_p;
    uVar1 = local_58._M_string_length;
    __s2._M_p = local_38._M_dataplus._M_p;
    uVar2 = local_38._M_string_length;
    if (local_38._M_string_length < local_58._M_string_length) {
      __n = local_38._M_string_length;
    }
  }
  if ((__n == 0) || (uVar3 = memcmp(__s1._M_p,__s2._M_p,__n), uVar3 == 0)) {
    uVar4 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar1 - uVar2)) {
      uVar4 = uVar1 - uVar2;
    }
    if (0x7ffffffe < (long)uVar4) {
      uVar4 = 0;
    }
  }
  else {
    uVar4 = (ulong)uVar3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return (bool)((byte)(uVar4 >> 0x1f) & 1);
}

Assistant:

bool operator()(const std::string& a, const std::string& b)
  {
    std::string af = ApplyFilter(a);
    std::string bf = ApplyFilter(b);
    bool result;
    if (descending) {
      result = bf < af;
    } else {
      result = af < bf;
    }
    return result;
  }